

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O0

void absl::flags_internal::ForEachFlag(function<void_(absl::CommandLineFlag_&)> *visitor)

{
  bool bVar1;
  FlagRegistry *fr;
  reference ppVar2;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*> *i_1;
  iterator __end2;
  iterator __begin2;
  FlagMap *__range2;
  FlagRegistryLock frl;
  CommandLineFlag **i;
  iterator __end3;
  iterator __begin3;
  vector<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_> *__range3;
  FlagRegistry *registry;
  function<void_(absl::CommandLineFlag_&)> *visitor_local;
  
  fr = FlagRegistry::GlobalRegistry();
  bVar1 = std::atomic<bool>::load(&fr->finalized_flags_,memory_order_acquire);
  if (bVar1) {
    __end3 = std::vector<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>::begin
                       (&fr->flat_flags_);
    i = (CommandLineFlag **)
        std::vector<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>::end
                  (&fr->flat_flags_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<absl::CommandLineFlag_**,_std::vector<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>_>
                                       *)&i), bVar1) {
      frl.fr_ = (FlagRegistry *)
                __gnu_cxx::
                __normal_iterator<absl::CommandLineFlag_**,_std::vector<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>_>
                ::operator*(&__end3);
      std::function<void_(absl::CommandLineFlag_&)>::operator()
                (visitor,*(CommandLineFlag **)
                          &((frl.fr_)->flags_).
                           super_raw_hash_map<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
                           .
                           super_raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
                           .settings_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::CommonFields,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .super_Storage<absl::container_internal::CommonFields,_0UL,_false>.value)
      ;
      __gnu_cxx::
      __normal_iterator<absl::CommandLineFlag_**,_std::vector<absl::CommandLineFlag_*,_std::allocator<absl::CommandLineFlag_*>_>_>
      ::operator++(&__end3);
    }
  }
  anon_unknown_6::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&__range2,fr);
  join_0x00000010_0x00000000_ =
       container_internal::
       raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
       ::begin((raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
                *)fr);
  _i_1 = container_internal::
         raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
         ::end((raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
                *)fr);
  while (bVar1 = container_internal::operator!=((iterator *)&__end2.field_1,(iterator *)&i_1), bVar1
        ) {
    ppVar2 = container_internal::
             raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
             ::iterator::operator*((iterator *)&__end2.field_1);
    std::function<void_(absl::CommandLineFlag_&)>::operator()(visitor,ppVar2->second);
    container_internal::
    raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
    ::iterator::operator++((iterator *)&__end2.field_1);
  }
  anon_unknown_6::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&__range2);
  return;
}

Assistant:

void ForEachFlag(std::function<void(CommandLineFlag&)> visitor) {
  FlagRegistry& registry = FlagRegistry::GlobalRegistry();

  if (registry.finalized_flags_.load(std::memory_order_acquire)) {
    for (const auto& i : registry.flat_flags_) visitor(*i);
  }

  FlagRegistryLock frl(registry);
  for (const auto& i : registry.flags_) visitor(*i.second);
}